

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Conductor.cpp
# Opt level: O1

void __thiscall Conductor::HandleQueriesDBPnetwork(Conductor *this)

{
  return;
}

Assistant:

void Conductor::HandleQueriesDBPnetwork() {
//	diplo::SRV.Start();
//	queries::LUBM_network lubm; //FIXME why without this line it breaks????????
//
//	queries::DBP_network dbp;
//
//	vector< vector<double> > times4exel;
//	times4exel.resize(5);
//	double time;
//
//	for (int i = 0; i < 11; i++) {
//		cout << "--------------------- ROUND: " << i << "---------------------" << endl;
//		diplo::stopwatch_start();
//		dbp.q01_m();
//		time = diplo::stopwatch_get();
//		times4exel[0].push_back(time);
//		cout << "q01: " << time << endl;
//		sleep(diplo::pause_int);
//
//		diplo::stopwatch_start();
//		dbp.q02_m();
//		time = diplo::stopwatch_get();
//		times4exel[1].push_back(time);
//		cout << "q02: " << time << endl;
//		sleep(diplo::pause_int);
//
//		diplo::stopwatch_start();
//		dbp.q03_m();
//		time = diplo::stopwatch_get();
//		times4exel[2].push_back(time);
//		cout << "q03: " << time << endl;
//		sleep(diplo::pause_int);
//
//		diplo::stopwatch_start();
//		dbp.q04_m();
//		time = diplo::stopwatch_get();
//		times4exel[3].push_back(time);
//		cout << "q04: " << time << endl;
//		sleep(diplo::pause_int);
//
//		diplo::stopwatch_start();
//		dbp.q05_m();
//		time = diplo::stopwatch_get();
//		times4exel[4].push_back(time);
//		cout << "q05: " << time << endl;
//		sleep(diplo::pause_int);
//	}
//
//
//	/////printing for exel
//	{
//		cout << endl << endl;
//		for (vector<vector<double> >::iterator q = times4exel.begin(); q != times4exel.end(); q++) {
//			for (size_t r = 0; r < q->size(); r++) {
//				string n = to_string((*q)[r]);
//				replace(n.begin(), n.end(), '.', ',');
//				cout << n << "\t";
//			}
//			cout << endl;
//		}
//	}

}